

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O2

float __thiscall
poisson_loss::getLoss(poisson_loss *this,shared_data *param_1,float prediction,float label)

{
  ostream *poVar1;
  float fVar2;
  float fVar3;
  
  if (label < 0.0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"You are using label ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,label);
    poVar1 = std::operator<<(poVar1," but loss function expects label >= 0!");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  fVar2 = expf(prediction);
  fVar3 = logf(label + 1e-06);
  fVar2 = (fVar3 - prediction) * label - (label - fVar2);
  return fVar2 + fVar2;
}

Assistant:

float getLoss(shared_data*, float prediction, float label)
  {
    if (label < 0.f)
      cout << "You are using label " << label << " but loss function expects label >= 0!" << endl;
    float exp_prediction = expf(prediction);
    // deviance is used instead of log-likelihood
    return 2 * (label * (logf(label + 1e-6f) - prediction) - (label - exp_prediction));
  }